

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O1

void lj_dispatch_profile(lua_State *L,BCIns *pc)

{
  int iVar1;
  uint uVar2;
  undefined4 uVar3;
  TValue *pTVar4;
  BCReg BVar5;
  int *piVar6;
  ulong uVar7;
  
  piVar6 = __errno_location();
  iVar1 = *piVar6;
  pTVar4 = L->base;
  uVar2 = *(uint *)((ulong)pTVar4[-1].u32.lo + 0x10);
  uVar7 = (ulong)L->cframe & 0xfffffffffffffffc;
  uVar3 = *(undefined4 *)(uVar7 + 0x1c);
  *(int *)(uVar7 + 0x1c) = (int)pc;
  BVar5 = cur_topslot((GCproto *)((ulong)uVar2 - 0x40),pc,*(uint32_t *)(uVar7 + 4));
  L->top = pTVar4 + BVar5;
  lj_profile_interpreter(L);
  *(undefined4 *)(uVar7 + 0x1c) = uVar3;
  uVar7 = (ulong)(L->glref).ptr32;
  *(int *)(uVar7 + 0x188) = (int)L;
  *(undefined4 *)(uVar7 + 0x160) = 0xffffffff;
  *piVar6 = iVar1;
  return;
}

Assistant:

void LJ_FASTCALL lj_dispatch_profile(lua_State *L, const BCIns *pc)
{
  ERRNO_SAVE
  GCfunc *fn = curr_func(L);
  GCproto *pt = funcproto(fn);
  void *cf = cframe_raw(L->cframe);
  const BCIns *oldpc = cframe_pc(cf);
  global_State *g;
  setcframe_pc(cf, pc);
  L->top = L->base + cur_topslot(pt, pc, cframe_multres_n(cf));
  lj_profile_interpreter(L);
  setcframe_pc(cf, oldpc);
  g = G(L);
  setgcref(g->cur_L, obj2gco(L));
  setvmstate(g, INTERP);
  ERRNO_RESTORE
}